

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

uint __thiscall OpenMD::SimInfo::getNLocalCutoffGroups(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  
  p_Var3 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  iVar6 = 0;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var5 = p_Var3[1]._M_parent, iVar6 = 0, p_Var5 != (_Base_ptr)0x0)) {
    iVar6 = 0;
    do {
      p_Var4 = p_Var5[5]._M_right;
      if (p_Var4 != *(_Base_ptr *)(p_Var5 + 6)) {
        p_Var2 = *(_Base_ptr *)p_Var4;
        while (p_Var2 != (_Base_ptr)0x0) {
          p_Var4 = (_Base_ptr)&p_Var4->_M_parent;
          iVar6 = (int)((ulong)((long)p_Var2->_M_parent - *(long *)p_Var2) >> 3) + iVar6;
          if (p_Var4 == *(_Base_ptr *)(p_Var5 + 6)) break;
          p_Var2 = *(_Base_ptr *)p_Var4;
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (((_Rb_tree_header *)p_Var3 != p_Var1) &&
            (p_Var5 = p_Var3[1]._M_parent, p_Var5 != (_Base_ptr)0x0));
  }
  return (this->nAtoms_ - iVar6) + this->nCutoffGroups_;
}

Assistant:

unsigned int SimInfo::getNLocalCutoffGroups() {
    int nLocalCutoffAtoms = 0;
    Molecule* mol;
    MoleculeIterator mi;
    CutoffGroup* cg;
    Molecule::CutoffGroupIterator ci;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        nLocalCutoffAtoms += cg->getNumAtom();
      }
    }

    return nAtoms_ - nLocalCutoffAtoms + nCutoffGroups_;
  }